

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::WindyTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,WindyTexture *this)

{
  TextureMapping3DHandle *in_RCX;
  
  StringPrintf<pbrt::TextureMapping3DHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ WindyTexture mapping: %s ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string WindyTexture::ToString() const {
    return StringPrintf("[ WindyTexture mapping: %s ]", mapping);
}